

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O2

string * __thiscall
cmPolicies::GetRequiredPolicyError_abi_cxx11_
          (string *__return_storage_ptr__,cmPolicies *this,PolicyID id)

{
  char *pcVar1;
  PolicyID id_00;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  id_00 = (PolicyID)this;
  pcVar1 = idToString(id_00);
  local_38 = pcVar1;
  local_40 = idToShortDescription(id_00);
  local_58 = pcVar1;
  local_48 = pcVar1;
  local_50 = idToVersion(id_00);
  cmStrCat<char_const(&)[8],char_const*,char_const(&)[21],char_const*,char_const(&)[28],char_const*,char_const(&)[156],char_const*,char_const(&)[73],char_const*,char_const(&)[75]>
            (__return_storage_ptr__,(char (*) [8])"Policy ",&local_38,
             (char (*) [21])" is not set to NEW: ",&local_40,
             (char (*) [28])"  Run \"cmake --help-policy ",&local_58,
             (char (*) [156])
             "\" for policy details.  CMake now requires this policy to be set to NEW by the project.  The policy may be set explicitly using the code\n  cmake_policy(SET "
             ,&local_48,
             (char (*) [73])
             " NEW)\nor by upgrading all policies with the code\n  cmake_policy(VERSION ",&local_50,
             (char (*) [75])
             ") # or later\nRun \"cmake --help-command cmake_policy\" for more information.");
  return __return_storage_ptr__;
}

Assistant:

std::string cmPolicies::GetRequiredPolicyError(cmPolicies::PolicyID id)
{
  return cmStrCat(
    "Policy ", idToString(id),
    " is not set to NEW: ", idToShortDescription(id),
    "  "
    "Run \"cmake --help-policy ",
    idToString(id),
    "\" for policy details.  "
    "CMake now requires this policy to be set to NEW by the project.  "
    "The policy may be set explicitly using the code\n"
    "  cmake_policy(SET ",
    idToString(id),
    " NEW)\n"
    "or by upgrading all policies with the code\n"
    "  cmake_policy(VERSION ",
    idToVersion(id),
    ") # or later\n"
    "Run \"cmake --help-command cmake_policy\" for more information.");
}